

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void Catch::defaultListTags
               (ostream *out,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags,
               bool isFiltered)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pTVar4;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar5;
  size_t sVar6;
  ostream *poVar7;
  undefined7 in_register_00000011;
  long lVar8;
  char *pcVar9;
  pointer this;
  string str;
  ReusableStringStream rss;
  Column wrapper;
  string local_108;
  long *local_e8;
  size_t local_e0;
  long local_d8 [2];
  AnsiSkippingString local_c8;
  undefined8 local_a0;
  size_t sStack_98;
  undefined8 uStack_90;
  vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *local_88;
  ReusableStringStream local_80;
  Column local_70;
  
  if ((int)CONCAT71(in_register_00000011,isFiltered) == 0) {
    pcVar9 = "All available tags:\n";
    lVar8 = 0x14;
  }
  else {
    pcVar9 = "Tags for matching test cases:\n";
    lVar8 = 0x1e;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar9,lVar8);
  this = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
         super__Vector_impl_data._M_start;
  pTVar4 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_88 = tags;
  if (this != pTVar4) {
    paVar1 = &local_c8.m_string.field_2;
    paVar2 = &local_108.field_2;
    paVar3 = &local_70.m_string.m_string.field_2;
    do {
      pSVar5 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      sVar6 = StringStreams::add(&pSVar5->super_StringStreams);
      local_80.m_index = sVar6;
      pSVar5 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
               getInternal();
      poVar7 = (ostream *)
               (pSVar5->super_StringStreams).m_streams.
               super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar6].m_ptr;
      local_80.m_oss = poVar7;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 2;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"  ",2);
      std::__cxx11::stringbuf::str();
      TagInfo::all_abi_cxx11_(&local_108,this);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == paVar2) {
        local_c8.m_string.field_2._8_8_ = local_108.field_2._8_8_;
        local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_c8.m_string._M_dataplus._M_p = local_108._M_dataplus._M_p;
      }
      local_c8.m_string.field_2._M_allocated_capacity._1_7_ =
           local_108.field_2._M_allocated_capacity._1_7_;
      local_c8.m_string.field_2._M_local_buf[0] = local_108.field_2._M_local_buf[0];
      local_c8.m_string._M_string_length = local_108._M_string_length;
      local_108._M_string_length = 0;
      local_108.field_2._M_local_buf[0] = '\0';
      local_c8.m_size = 0;
      local_108._M_dataplus._M_p = (pointer)paVar2;
      TextFlow::AnsiSkippingString::preprocessString(&local_c8);
      uStack_90 = 0;
      sStack_98 = local_e0;
      local_a0 = 0x46;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.m_string._M_dataplus._M_p == paVar1) {
        local_70.m_string.m_string.field_2._8_8_ = local_c8.m_string.field_2._8_8_;
        local_70.m_string.m_string._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_70.m_string.m_string._M_dataplus._M_p = local_c8.m_string._M_dataplus._M_p;
      }
      local_70.m_string.m_string.field_2._M_allocated_capacity =
           local_c8.m_string.field_2._M_allocated_capacity;
      local_70.m_string.m_string._M_string_length = local_c8.m_string._M_string_length;
      local_c8.m_string._M_string_length = 0;
      local_c8.m_string.field_2._M_allocated_capacity =
           local_c8.m_string.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_70.m_string.m_size = local_c8.m_size;
      local_70.m_initialIndent = 0;
      local_70.m_width = 0x46;
      local_70.m_indent = local_e0;
      local_c8.m_string._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != paVar2) {
        operator_delete(local_108._M_dataplus._M_p,
                        CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                                 local_108.field_2._M_local_buf[0]) + 1);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_e8,local_e0);
      TextFlow::operator<<(poVar7,&local_70);
      local_c8.m_string._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_c8,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.m_string.m_string._M_dataplus._M_p != paVar3) {
        operator_delete(local_70.m_string.m_string._M_dataplus._M_p,
                        local_70.m_string.m_string.field_2._M_allocated_capacity + 1);
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8,local_d8[0] + 1);
      }
      ReusableStringStream::~ReusableStringStream(&local_80);
      this = this + 1;
    } while (this != pTVar4);
  }
  local_70.m_string.m_string._M_dataplus._M_p =
       (pointer)(((long)(local_88->
                        super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl
                        .super__Vector_impl_data._M_finish -
                  (long)(local_88->
                        super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl
                        .super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  local_70.m_string.m_string._M_string_length = 0x180b68;
  local_70.m_string.m_string.field_2._M_allocated_capacity = 3;
  operator<<(out,(pluralise *)&local_70);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\n\n",2);
  std::ostream::flush();
  return;
}

Assistant:

void defaultListTags( std::ostream& out,
                          std::vector<TagInfo> const& tags,
                          bool isFiltered ) {
        if ( isFiltered ) {
            out << "Tags for matching test cases:\n";
        } else {
            out << "All available tags:\n";
        }

        for ( auto const& tagCount : tags ) {
            ReusableStringStream rss;
            rss << "  " << std::setw( 2 ) << tagCount.count << "  ";
            auto str = rss.str();
            auto wrapper = TextFlow::Column( tagCount.all() )
                               .initialIndent( 0 )
                               .indent( str.size() )
                               .width( CATCH_CONFIG_CONSOLE_WIDTH - 10 );
            out << str << wrapper << '\n';
        }
        out << pluralise(tags.size(), "tag"_sr) << "\n\n" << std::flush;
    }